

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O3

int point_mul_g_id_tc26_gost_3410_2012_512_paramSetA
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,BN_CTX *ctx)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  pt_aff_t_conflict2 (*papVar9) [16];
  pt_aff_t_conflict2 *ppVar10;
  byte bVar11;
  limb_t *plVar12;
  uint64_t *puVar13;
  long lVar14;
  bool bVar15;
  uchar b_n [64];
  uchar b_x [64];
  uchar b_y [64];
  int8_t rnaf [103];
  uint64_t local_3f8 [10];
  uint64_t local_3a8;
  long lStack_3a0;
  long local_398;
  long lStack_390;
  long local_388;
  long lStack_380;
  long local_378;
  long lStack_370;
  long local_368;
  long lStack_360;
  pt_aff_t_conflict2 local_358;
  byte local_2b8 [64];
  undefined1 local_278 [32];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  uint64_t local_228 [10];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  pt_prj_t_conflict2 local_188;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [15];
  undefined1 uStack_39;
  undefined7 uStack_38;
  
  bVar11 = 0;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar4 = BN_CTX_get((BN_CTX *)ctx);
  pBVar5 = BN_CTX_get((BN_CTX *)ctx);
  iVar8 = 0;
  if ((pBVar5 != (BIGNUM *)0x0) &&
     (iVar3 = BN_bn2lebinpad(n,local_2b8,0x40), iVar8 = 0, iVar3 == 0x40)) {
    local_48 = SUB1615((undefined1  [16])0x0,0);
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    uStack_39 = 0;
    uStack_38 = 0;
    memset(&local_188,0,0xf0);
    memset(&local_358,0,0xa0);
    scalar_rwnaf(local_98,local_2b8);
    local_238 = (undefined1  [16])0x0;
    local_248 = (undefined1  [16])0x0;
    local_258 = (undefined1  [16])0x0;
    local_278._16_16_ = (undefined1  [16])0x0;
    local_278._0_16_ = (undefined1  [16])0x0;
    plVar12 = const_one;
    puVar13 = local_228;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar13 = *plVar12;
      plVar12 = plVar12 + (ulong)bVar11 * -2 + 1;
      puVar13 = puVar13 + (ulong)bVar11 * -2 + 1;
    }
    local_198 = (undefined1  [16])0x0;
    local_1a8 = (undefined1  [16])0x0;
    local_1b8 = (undefined1  [16])0x0;
    local_1c8 = (undefined1  [16])0x0;
    local_1d8 = (undefined1  [16])0x0;
    puVar13 = local_358.Y;
    lVar6 = 9;
    do {
      if (lVar6 != 9) {
        iVar8 = 5;
        do {
          point_double((pt_prj_t_conflict2 *)local_278,(pt_prj_t_conflict2 *)local_278);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      papVar9 = lut_cmb;
      lVar7 = 0;
      do {
        uVar1 = lVar6 + lVar7 * 10;
        if (uVar1 < 0x67) {
          cVar2 = local_98[uVar1];
          lVar14 = 0;
          ppVar10 = *papVar9;
          do {
            bVar15 = (int)((int)(char)(-1 - (cVar2 >> 7)) + ((int)cVar2 >> 0x1f ^ (int)cVar2) >> 1 ^
                          (uint)lVar14) < 1;
            fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                      (local_358.X,bVar15,local_358.X,ppVar10->X);
            fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(puVar13,bVar15,puVar13,ppVar10->Y);
            lVar14 = lVar14 + 1;
            ppVar10 = ppVar10 + 1;
          } while (lVar14 != 0x10);
          local_3a8 = 0x1ffffffffffb8e - local_358.Y[0];
          lStack_3a0 = 0xffffffffffffe - local_358.Y[1];
          local_388 = 0xffffffffffffe - local_358.Y[4];
          lStack_380 = 0x1ffffffffffffe - local_358.Y[5];
          local_398 = 0xffffffffffffe - local_358.Y[2];
          lStack_390 = 0xffffffffffffe - local_358.Y[3];
          local_378 = 0xffffffffffffe - local_358.Y[6];
          lStack_370 = 0xffffffffffffe - local_358.Y[7];
          local_368 = 0xffffffffffffe - local_358.Y[8];
          lStack_360 = 0xffffffffffffe - local_358.Y[9];
          fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                    (puVar13,(byte)(cVar2 >> 7) >> 7,puVar13,&local_3a8);
          point_add_mixed((pt_prj_t_conflict2 *)local_278,(pt_prj_t_conflict2 *)local_278,&local_358
                         );
        }
        lVar7 = lVar7 + 1;
        papVar9 = (pt_aff_t_conflict2 (*) [16])((long)papVar9 + 0xa00);
      } while (lVar7 != 0xc);
      bVar15 = lVar6 != 0;
      lVar6 = lVar6 + -1;
    } while (bVar15);
    papVar9 = lut_cmb;
    ppVar10 = &local_358;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      ppVar10->X[0] = (*papVar9)[0].X[0];
      papVar9 = (pt_aff_t_conflict2 (*) [16])((long)papVar9 + ((ulong)bVar11 * -2 + 1) * 8);
      ppVar10 = (pt_aff_t_conflict2 *)((long)ppVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    local_358.Y[0] = 0x1a7634adea08ea;
    local_358.Y[1] = 0xa03dca0a47764;
    local_358.Y[2] = 0xb8b7c2cffae02;
    local_358.Y[3] = 0xa45b0a28656bb;
    local_358.Y[4] = 0x9074eca0d817d;
    local_358.Y[5] = 0x1f9b02341056dd;
    local_358.Y[6] = 0xec530e543e886;
    local_358.Y[7] = 0xb575e326343c5;
    local_358.Y[8] = 0xd4716791dfa46;
    local_358.Y[9] = 0xc57e180bc2be3;
    point_add_mixed(&local_188,(pt_prj_t_conflict2 *)local_278,&local_358);
    bVar11 = local_2b8[0] & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
              ((uint64_t *)local_278,bVar11,local_188.X,(uint64_t *)local_278);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(local_228,bVar11,local_188.Y,local_228);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
              ((uint64_t *)local_1d8,bVar11,local_188.Z,(uint64_t *)local_1d8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_inv((uint64_t *)local_1d8,(uint64_t *)local_1d8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
              (local_3f8,(uint64_t *)local_278,(uint64_t *)local_1d8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_3a8,local_228,(uint64_t *)local_1d8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(local_278,local_3f8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes((uint8_t *)&local_188,&local_3a8);
    iVar8 = CRYPTO_memcmp("",local_278,0x40);
    if ((iVar8 == 0) && (iVar8 = CRYPTO_memcmp("",&local_188,0x40), iVar8 == 0)) {
      iVar8 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar8 == 0) {
        iVar8 = 0;
        goto LAB_001338b9;
      }
    }
    else {
      lVar6 = BN_lebin2bn(local_278,0x40,pBVar4);
      iVar8 = 0;
      if ((lVar6 == 0) ||
         ((lVar6 = BN_lebin2bn(&local_188,0x40,pBVar5), lVar6 == 0 ||
          (iVar3 = EC_POINT_set_affine_coordinates(group,r,pBVar4,pBVar5,ctx), iVar8 = 0, iVar3 == 0
          )))) goto LAB_001338b9;
    }
    iVar8 = 1;
  }
LAB_001338b9:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar8;
}

Assistant:

int
    point_mul_g_id_tc26_gost_3410_2012_512_paramSetA(const EC_GROUP *group,
                                                     EC_POINT *r,
                                                     const BIGNUM *n,
                                                     BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL || BN_bn2lebinpad(n, b_n, 64) != 64)
        goto err;
    /* do the fixed scalar multiplication */
    point_mul_g(b_x, b_y, b_n);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}